

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

void vkt::Draw::MemoryOp::unpack
               (int pixelSize,int width,int height,int depth,VkDeviceSize rowPitchOrZero,
               VkDeviceSize depthPitchOrZero,void *srcBuffer,void *destBuffer)

{
  VkDeviceSize VVar1;
  long lVar2;
  int iVar3;
  void *__src;
  size_t __n;
  void *__dest;
  
  __n = (size_t)(pixelSize * width);
  if (rowPitchOrZero == 0) {
    rowPitchOrZero = __n;
  }
  VVar1 = (long)height * rowPitchOrZero;
  if (depthPitchOrZero == 0) {
    depthPitchOrZero = VVar1;
  }
  if (depthPitchOrZero == VVar1 && rowPitchOrZero == __n) {
    memcpy(destBuffer,srcBuffer,VVar1 * (long)depth);
    return;
  }
  if (depth != 0) {
    lVar2 = 0;
    do {
      if (0 < height) {
        __dest = (void *)(lVar2 * (pixelSize * width * height) + (long)destBuffer);
        __src = (void *)(lVar2 * depthPitchOrZero + (long)srcBuffer);
        iVar3 = height;
        do {
          memcpy(__dest,__src,__n);
          __src = (void *)((long)__src + rowPitchOrZero);
          __dest = (void *)((long)__dest + __n);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != depth);
  }
  return;
}

Assistant:

void MemoryOp::unpack (int					pixelSize,
					   int					width,
					   int					height,
					   int					depth,
					   vk::VkDeviceSize		rowPitchOrZero,
					   vk::VkDeviceSize		depthPitchOrZero,
					   const void *			srcBuffer,
					   void *				destBuffer)
{
	vk::VkDeviceSize rowPitch	= rowPitchOrZero;
	vk::VkDeviceSize depthPitch = depthPitchOrZero;

	if (rowPitch == 0)
		rowPitch = width * pixelSize;

	if (depthPitch == 0)
		depthPitch = rowPitch * height;

	const vk::VkDeviceSize size = depthPitch * depth;

	const deUint8 *srcRow = reinterpret_cast<const deUint8 *>(srcBuffer);
	const deUint8 *srcStart;
	srcStart = srcRow;
	deUint8 *dstRow = reinterpret_cast<deUint8 *>(destBuffer);
	deUint8 *dstStart;
	dstStart = dstRow;

	if (rowPitch == static_cast<vk::VkDeviceSize>(width * pixelSize) &&
		depthPitch == static_cast<vk::VkDeviceSize>(rowPitch * height))
	{
		// fast path
		deMemcpy(dstRow, srcRow, static_cast<size_t>(size));
	}
	else {
		// slower, per row path
		for (size_t d = 0; d < (size_t)depth; d++)
		{
			vk::VkDeviceSize offsetDepthDst = d * (pixelSize * width * height);
			vk::VkDeviceSize offsetDepthSrc = d * depthPitch;
			srcRow = srcStart + offsetDepthSrc;
			dstRow = dstStart + offsetDepthDst;
			for (int r = 0; r < height; ++r)
			{
				deMemcpy(dstRow, srcRow, static_cast<size_t>(pixelSize * width));
				srcRow += rowPitch;
				dstRow += pixelSize * width;
			}
		}
	}
}